

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O3

void __thiscall
UnitTests::Assert::Equals<int,int>(Assert *this,string *msg,int *expected,int *actual)

{
  uint *puVar1;
  ostream *poVar2;
  ostringstream s;
  string local_1b8;
  long local_198 [3];
  uint auStack_180 [88];
  
  if (*expected == *actual) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  if (msg->_M_string_length != 0) {
    local_1b8._M_dataplus._M_p = (pointer)msg;
    poVar2 = details::operator<<((ostream *)local_198,
                                 (expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  }
  puVar1 = (uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"    Expected <",0xe);
  std::ostream::operator<<((ostream *)local_198,*expected);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,">\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"     but got <",0xe);
  std::ostream::operator<<((ostream *)local_198,*actual);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,">\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"  ",2);
  std::__cxx11::stringbuf::str();
  Error(this,&local_1b8);
}

Assistant:

void Equals(const std::string& msg, const T& expected, const U& actual) const
        {
            if (!are_equal(std::common_type_t<T, U>(expected), std::common_type_t<T, U>(actual)))
            {
                auto s = std::ostringstream{};
                if (!msg.empty())
                    s << stream(msg) << " ";

                s << std::boolalpha << "\n";
                s << "    Expected <" << stream_with_coercion(std::common_type_t<T, U>(expected), expected) << ">\n";
                s << "     but got <" << stream_with_coercion(std::common_type_t<T, U>(actual), actual) << ">\n";
                s << "  ";
                Error(s.str());
            }
        }